

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WScriptJsrt.cpp
# Opt level: O2

JsValueRef
WScriptJsrt::GetReportCallback
          (JsValueRef callee,bool isConstructCall,JsValueRef *arguments,unsigned_short argumentCount
          ,void *callbackState)

{
  JsErrorCode JVar1;
  RuntimeThreadLocalData *pRVar2;
  undefined2 in_register_0000000a;
  RuntimeThreadData *pRVar3;
  char *local_48;
  value_type str;
  JsValueRef returnValue;
  
  str.field_2._8_8_ = 0;
  JVar1 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtGetNullValue)
                    ((JsValueRef *)((long)&str.field_2 + 8));
  if ((CONCAT22(in_register_0000000a,argumentCount) != 0) && (JVar1 == JsNoError)) {
    pRVar2 = GetRuntimeThreadLocalData();
    if (pRVar2->threadData != (RuntimeThreadData *)0x0) {
      EnterCriticalSection(&pRVar2->threadData->csReportQ);
      pRVar3 = pRVar2->threadData;
      if ((pRVar3->reportQ).
          super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl._M_node._M_size != 0) {
        std::__cxx11::string::string
                  ((string *)&local_48,
                   (string *)
                   ((pRVar3->reportQ).
                    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl._M_node.super__List_node_base._M_next + 1));
        std::__cxx11::
        list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::pop_front(&pRVar2->threadData->reportQ);
        (*ChakraRTInterface::m_jsApiHooks.pfJsrtCreateString)
                  (local_48,(size_t)str._M_dataplus._M_p,(JsValueRef *)((long)&str.field_2 + 8));
        std::__cxx11::string::~string((string *)&local_48);
        pRVar3 = pRVar2->threadData;
      }
      LeaveCriticalSection(&pRVar3->csReportQ);
    }
  }
  return (JsValueRef)str.field_2._8_8_;
}

Assistant:

JsValueRef __stdcall WScriptJsrt::GetReportCallback(JsValueRef callee, bool isConstructCall, JsValueRef *arguments, unsigned short argumentCount, void *callbackState)
{
    HRESULT hr = E_FAIL;
    JsValueRef returnValue = JS_INVALID_REFERENCE;
    JsErrorCode errorCode = JsNoError;

    IfJsrtErrorSetGo(ChakraRTInterface::JsGetNullValue(&returnValue));

    if (argumentCount > 0)
    {
        auto& threadData = GetRuntimeThreadLocalData().threadData;
        if (threadData)
        {
            EnterCriticalSection(&threadData->csReportQ);

            if (threadData->reportQ.size() > 0)
            {
                auto str = threadData->reportQ.front();
                threadData->reportQ.pop_front();
                ChakraRTInterface::JsCreateString(str.c_str(), str.size(), &returnValue);
            }
            LeaveCriticalSection(&threadData->csReportQ);
        }
    }

Error:
    return returnValue;
}